

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinc_resampler.cc
# Opt level: O3

void __thiscall webrtc::SincResampler::InitializeKernel(SincResampler *this)

{
  float fVar1;
  double dVar2;
  size_t i;
  long lVar3;
  long lVar4;
  size_t offset_idx;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  float fVar9;
  
  uVar6 = -(ulong)(1.0 < this->io_sample_rate_ratio_);
  dVar2 = (double)(~uVar6 & 0x3feccccccccccccd |
                  (ulong)((1.0 / this->io_sample_rate_ratio_) * 0.9) & uVar6);
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar3 = 0;
    do {
      fVar1 = ((float)((int)lVar3 + -0x10) - (float)lVar5 * 0.03125) * 3.1415927;
      *(float *)((long)(this->kernel_pre_sinc_storage_)._M_t.
                       super___uniq_ptr_impl<float,_webrtc::AlignedFreeDeleter>._M_t.
                       super__Tuple_impl<0UL,_float_*,_webrtc::AlignedFreeDeleter>.
                       super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar3 * 4 + lVar4) =
           fVar1;
      dVar7 = (double)(((float)lVar3 - (float)lVar5 * 0.03125) * 0.03125);
      dVar8 = cos(dVar7 * 6.283185307179586);
      dVar7 = cos(dVar7 * 12.566370614359172);
      fVar9 = (float)(dVar7 * 0.08 + dVar8 * -0.5 + 0.42);
      *(float *)((long)(this->kernel_window_storage_)._M_t.
                       super___uniq_ptr_impl<float,_webrtc::AlignedFreeDeleter>._M_t.
                       super__Tuple_impl<0UL,_float_*,_webrtc::AlignedFreeDeleter>.
                       super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar3 * 4 + lVar4) =
           fVar9;
      if ((fVar1 != 0.0) || (dVar7 = dVar2, NAN(fVar1))) {
        dVar7 = sin(dVar2 * (double)fVar1);
        dVar7 = dVar7 / (double)fVar1;
      }
      *(float *)((long)(this->kernel_storage_)._M_t.
                       super___uniq_ptr_impl<float,_webrtc::AlignedFreeDeleter>._M_t.
                       super__Tuple_impl<0UL,_float_*,_webrtc::AlignedFreeDeleter>.
                       super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar3 * 4 + lVar4) =
           (float)((double)fVar9 * dVar7);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x20);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x80;
  } while (lVar5 != 0x21);
  return;
}

Assistant:

void SincResampler::InitializeKernel() {
  // Blackman window parameters.
  static const double kAlpha = 0.16;
  static const double kA0 = 0.5 * (1.0 - kAlpha);
  static const double kA1 = 0.5;
  static const double kA2 = 0.5 * kAlpha;

  // Generates a set of windowed sinc() kernels.
  // We generate a range of sub-sample offsets from 0.0 to 1.0.
  const double sinc_scale_factor = SincScaleFactor(io_sample_rate_ratio_);
  for (size_t offset_idx = 0; offset_idx <= kKernelOffsetCount; ++offset_idx) {
    const float subsample_offset =
        static_cast<float>(offset_idx) / kKernelOffsetCount;

    for (size_t i = 0; i < kKernelSize; ++i) {
      const size_t idx = i + offset_idx * kKernelSize;
      const float pre_sinc = static_cast<float>(M_PI *
          (static_cast<int>(i) - static_cast<int>(kKernelSize / 2) -
           subsample_offset));
      kernel_pre_sinc_storage_[idx] = pre_sinc;

      // Compute Blackman window, matching the offset of the sinc().
      const float x = (i - subsample_offset) / kKernelSize;
      const float window = static_cast<float>(kA0 - kA1 * cos(2.0 * M_PI * x) +
          kA2 * cos(4.0 * M_PI * x));
      kernel_window_storage_[idx] = window;

      // Compute the sinc with offset, then window the sinc() function and store
      // at the correct offset.
      kernel_storage_[idx] = static_cast<float>(window *
          ((pre_sinc == 0) ?
              sinc_scale_factor :
              (sin(sinc_scale_factor * pre_sinc) / pre_sinc)));
    }
  }
}